

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::MutablePatternModifier::processQuantity
          (MutablePatternModifier *this,DecimalQuantity *fq,MicroProps *micros,UErrorCode *status)

{
  int8_t iVar1;
  int iVar2;
  Form FVar3;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  Form FVar4;
  UErrorCode statusLocal;
  UnicodeString ruleString;
  undefined1 local_c0 [80];
  UnicodeString local_70;
  
  __writefds = (fd_set *)status;
  (*this->fParent->_vptr_MicroPropsGenerator[2])();
  local_c0._0_4_ = 0;
  iVar2 = (*this->fPatternInfo->_vptr_AffixPatternProvider[9])(this->fPatternInfo,0xfffffff9);
  if ((char)iVar2 == '\0') {
    iVar1 = DecimalQuantity::signum(fq);
    this->fSignum = iVar1;
    this->fPlural = COUNT;
  }
  else {
    DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_c0,fq);
    RoundingImpl::apply(&micros->rounder,(DecimalQuantity *)local_c0,status);
    iVar1 = DecimalQuantity::signum(fq);
    if (this->fRules == (PluralRules *)0x0) {
      FVar4 = OTHER;
    }
    else {
      PluralRules::select((PluralRules *)(local_c0 + 0x50),(int)this->fRules,(fd_set *)local_c0,
                          __writefds,in_R8,in_R9);
      FVar3 = StandardPlural::indexOrNegativeFromString((UnicodeString *)(local_c0 + 0x50));
      FVar4 = OTHER;
      if (-1 < (int)FVar3) {
        FVar4 = FVar3;
      }
      UnicodeString::~UnicodeString((UnicodeString *)(local_c0 + 0x50));
    }
    this->fSignum = iVar1;
    this->fPlural = FVar4;
    DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_c0);
  }
  micros->modMiddle = &this->super_Modifier;
  return;
}

Assistant:

void MutablePatternModifier::processQuantity(DecimalQuantity& fq, MicroProps& micros,
                                             UErrorCode& status) const {
    fParent->processQuantity(fq, micros, status);
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);
    if (needsPlurals()) {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(fq);
        micros.rounder.apply(copy, status);
        nonConstThis->setNumberProperties(fq.signum(), utils::getStandardPlural(fRules, copy));
    } else {
        nonConstThis->setNumberProperties(fq.signum(), StandardPlural::Form::COUNT);
    }
    micros.modMiddle = this;
}